

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey.c
# Opt level: O2

void xsurv0_pipe_close(void *arg)

{
  nni_list *list;
  int iVar1;
  
  list = *(nni_list **)((long)arg + 8);
  nni_aio_close((nni_aio *)((long)arg + 0x28));
  nni_aio_close((nni_aio *)((long)arg + 0x3b8));
  nni_aio_close((nni_aio *)((long)arg + 0x580));
  nni_aio_close((nni_aio *)((long)arg + 0x1f0));
  nni_msgq_close(*(nni_msgq **)((long)arg + 0x10));
  nni_mtx_lock((nni_mtx *)&list[0x14].ll_offset);
  iVar1 = nni_list_active(list,arg);
  if (iVar1 != 0) {
    nni_list_remove(list,arg);
  }
  nni_mtx_unlock((nni_mtx *)&list[0x14].ll_offset);
  return;
}

Assistant:

static void
xsurv0_pipe_close(void *arg)
{
	xsurv0_pipe *p = arg;
	xsurv0_sock *s = p->psock;

	nni_aio_close(&p->aio_getq);
	nni_aio_close(&p->aio_send);
	nni_aio_close(&p->aio_recv);
	nni_aio_close(&p->aio_putq);

	nni_msgq_close(p->sendq);

	nni_mtx_lock(&s->mtx);
	if (nni_list_active(&s->pipes, p)) {
		nni_list_remove(&s->pipes, p);
	}
	nni_mtx_unlock(&s->mtx);
}